

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::BasicUsageCS::CheckProgram(BasicUsageCS *this,GLuint program,bool *compile_error)

{
  void *pvVar1;
  long lVar2;
  char *format;
  int iVar3;
  CallLogWrapper *this_00;
  bool bVar4;
  GLint length_1;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLenum type;
  GLint length;
  GLint res;
  GLint status;
  int local_8c;
  int local_88;
  allocator_type local_81;
  vector<char,_std::allocator<char>_> local_80;
  int local_64;
  vector<char,_std::allocator<char>_> local_60;
  GLuint local_44;
  int local_40;
  int local_3c;
  bool *local_38;
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_3c);
  if (local_3c == 0) {
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_88);
    if ((long)local_88 < 1) {
      bVar4 = false;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,(long)local_88,
                 (allocator_type *)&local_60);
      glu::CallLogWrapper::glGetAttachedShaders
                (this_00,program,local_88,(GLsizei *)0x0,
                 (GLuint *)
                 local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_88 < 1) {
        bVar4 = false;
      }
      else {
        iVar3 = 1;
        lVar2 = 0;
        local_44 = program;
        local_38 = compile_error;
        do {
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b4f,
                     &local_64);
          if (local_64 < 0x8e87) {
            if (local_64 == 0x8b30) {
              format = "*** Fragment Shader ***\n";
            }
            else {
              format = "*** Vertex Shader ***\n";
              if (local_64 != 0x8b31) {
                if (local_64 == 0x8dd9) {
                  format = "*** Geometry Shader ***\n";
                }
                else {
LAB_008d0d6c:
                  format = "*** Unknown Shader ***\n";
                }
              }
            }
          }
          else if (local_64 == 0x8e87) {
            format = "*** Tessellation Evaluation Shader ***\n";
          }
          else if (local_64 == 0x8e88) {
            format = "*** Tessellation Control Shader ***\n";
          }
          else {
            if (local_64 != 0x91b9) goto LAB_008d0d6c;
            format = "*** Compute Shader ***\n";
          }
          gl4cts::anon_unknown_0::Output(format);
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b81,
                     &local_40);
          if (local_40 != 1) {
            iVar3 = local_40;
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b88,
                     &local_8c);
          if (0 < (long)local_8c) {
            std::vector<char,_std::allocator<char>_>::vector(&local_60,(long)local_8c,&local_81);
            glu::CallLogWrapper::glGetShaderSource
                      (this_00,*(GLuint *)
                                ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_8c,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            gl4cts::anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_60.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
            pvVar1 = (void *)CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,*(GLuint *)
                              ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),0x8b84,
                     &local_8c);
          if (0 < (long)local_8c) {
            std::vector<char,_std::allocator<char>_>::vector(&local_60,(long)local_8c,&local_81);
            glu::CallLogWrapper::glGetShaderInfoLog
                      (this_00,*(GLuint *)
                                ((long)local_80.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2 * 4),
                       local_8c,(GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            gl4cts::anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_60.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
            pvVar1 = (void *)CONCAT44(local_60.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
            if (pvVar1 != (void *)0x0) {
              operator_delete(pvVar1,(long)local_60.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar1);
            }
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < local_88);
        bVar4 = iVar3 != 1;
        compile_error = local_38;
        program = local_44;
      }
      if ((GLuint *)
          local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (GLuint *)0x0) {
        operator_delete(local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_60);
    if (0 < (long)(int)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) {
      std::vector<char,_std::allocator<char>_>::vector
                (&local_80,
                 (long)(int)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,(allocator_type *)&local_64);
      glu::CallLogWrapper::glGetProgramInfoLog
                (this_00,program,
                 (int)local_60.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(GLsizei *)0x0,
                 local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      gl4cts::anon_unknown_0::Output
                ("%s\n",local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      if ((GLuint *)
          local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (GLuint *)0x0) {
        operator_delete(local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    bVar4 = false;
  }
  if (compile_error != (bool *)0x0) {
    *compile_error = bVar4;
  }
  return (bool)(~bVar4 & local_3c == 1);
}

Assistant:

bool CheckProgram(GLuint program, bool* compile_error = NULL)
	{
		GLint compile_status = GL_TRUE;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}

					GLint res;
					glGetShaderiv(shaders[i], GL_COMPILE_STATUS, &res);
					if (res != GL_TRUE)
						compile_status = res;

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}

		if (compile_error)
			*compile_error = (compile_status == GL_TRUE ? false : true);
		if (compile_status != GL_TRUE)
			return false;
		return status == GL_TRUE ? true : false;
	}